

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void BindInstAndMember(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeName *pPVar6;
  
  if (pnode->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x8ba,"(pnode->nop == knopDot)","pnode->nop == knopDot");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  BindReference(pnode,byteCodeGenerator);
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  pPVar6 = ParseNode::AsParseNodeName(pPVar5->pnode2);
  ByteCodeGenerator::AssignPropertyId(byteCodeGenerator,pPVar6->pid);
  pPVar6->symRef = (Symbol **)0x0;
  pPVar6->sym = (Symbol *)0x0;
  pbVar1 = (byte *)((long)&(pPVar6->super_ParseNode).grfpn + 1);
  *pbVar1 = *pbVar1 | 0x20;
  return;
}

Assistant:

void BindInstAndMember(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnode->nop == knopDot);

    BindReference(pnode, byteCodeGenerator);

    ParseNodeName *right = pnode->AsParseNodeBin()->pnode2->AsParseNodeName();    
    byteCodeGenerator->AssignPropertyId(right->pid);
    right->sym = nullptr;
    right->ClearSymRef();
    right->grfpn |= fpnMemberReference;
}